

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture1DArrayView *src,float *texCoord,ReferenceParams *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  LodMode mode;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  deInt32 srcSize;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Texture1DArrayView TVar22;
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture1DArrayView src_1;
  float local_d8 [8];
  undefined1 local_b8 [4];
  undefined8 uStack_b4;
  float fStack_ac;
  undefined8 local_a0;
  Vec3 local_98;
  Vec3 local_8c;
  undefined1 local_78 [16];
  pointer local_68;
  WrapMode local_58;
  ConstPixelBufferAccess *local_50;
  ulong local_48;
  undefined8 uStack_40;
  
  fVar16 = *texCoord;
  fVar17 = texCoord[1];
  fVar18 = texCoord[2];
  fVar19 = texCoord[4];
  fVar1 = texCoord[6];
  fVar2 = texCoord[3];
  fVar3 = texCoord[5];
  fVar4 = texCoord[7];
  local_78 = ZEXT416(0);
  local_68 = (pointer)0x0;
  TVar22 = tcu::getEffectiveTextureView
                     (src,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)local_78,&params->sampler);
  local_50 = TVar22.m_levels;
  local_58 = TVar22.m_numLevels;
  local_48 = 0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_48 = (ulong)(uint)(params->super_RenderParams).bias;
  }
  mode = dst->m_width;
  uVar13 = dst->m_height;
  uStack_40._0_1_ = false;
  uStack_40._1_3_ = 0;
  uStack_40._4_4_ = COMPAREMODE_NONE;
  if ((int)local_58 < 1) {
    srcSize = 0;
  }
  else {
    srcSize = (local_50->m_size).m_data[0];
  }
  local_d8[0] = fVar17;
  local_d8[1] = fVar2;
  local_d8[2] = fVar3;
  local_d8[3] = fVar4;
  local_d8[4] = fVar3;
  local_d8[5] = fVar2;
  local_98.m_data[0] = fVar16;
  local_98.m_data[1] = fVar18;
  local_98.m_data[2] = fVar19;
  local_8c.m_data[0] = fVar1;
  local_8c.m_data[1] = fVar19;
  local_8c.m_data[2] = fVar18;
  fVar16 = computeNonProjectedTriLod
                     ((TextureTestUtil *)(ulong)params->lodMode,mode,(IVec2 *)(ulong)uVar13,srcSize,
                      &local_98);
  fVar17 = computeNonProjectedTriLod
                     ((TextureTestUtil *)(ulong)params->lodMode,mode,(IVec2 *)(ulong)uVar13,srcSize,
                      &local_8c);
  local_a0 = CONCAT44(fVar17 + (float)local_48,fVar16 + (float)local_48);
  iVar15 = dst->m_height;
  if (0 < iVar15) {
    iVar8 = dst->m_width;
    iVar14 = 0;
    do {
      if (0 < iVar8) {
        iVar15 = 0;
        do {
          auVar20._0_4_ = (float)iVar15 + 0.5;
          auVar20._4_4_ = (float)iVar14 + 0.5;
          auVar20._8_8_ = 0;
          auVar21._0_4_ = (float)iVar8;
          auVar21._4_4_ = (float)dst->m_height;
          auVar21._8_8_ = 0;
          auVar21 = divps(auVar20,auVar21);
          fVar16 = auVar21._4_4_;
          bVar6 = 1.0 <= auVar21._0_4_ + fVar16;
          if (bVar6) {
            auVar21 = ZEXT416((uint)(1.0 - auVar21._0_4_));
            if (!bVar6) goto LAB_009f3303;
LAB_009f32ec:
            fVar17 = auVar21._0_4_;
            fVar16 = 1.0 - fVar16;
          }
          else {
            if (bVar6) goto LAB_009f32ec;
LAB_009f3303:
            fVar17 = auVar21._0_4_;
          }
          uVar7 = (ulong)bVar6;
          fVar18 = (&local_98)[uVar7].m_data[0];
          fVar19 = ((&local_98)[uVar7].m_data[1] - fVar18) * fVar16 +
                   ((&local_8c)[uVar7 - 1].m_data[2] - fVar18) * fVar17 + fVar18;
          fVar18 = local_d8[uVar7 * 3];
          fVar17 = (local_d8[uVar7 * 3 + 1] - fVar18) * fVar16 +
                   (local_d8[uVar7 * 3 + 2] - fVar18) * fVar17 + fVar18;
          fVar16 = *(float *)((long)&local_a0 + uVar7 * 4);
          if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
            local_b8 = (undefined1  [4])
                       tcu::Texture1DArrayView::sampleCompare
                                 ((Texture1DArrayView *)&local_58,&params->sampler,
                                  (params->super_RenderParams).ref,fVar19,fVar17,fVar16);
            uStack_b4 = 0;
            fStack_ac = 1.0;
          }
          else {
            tcu::Texture1DArrayView::sample
                      ((Texture1DArrayView *)local_b8,(Sampler *)&local_58,fVar19,fVar17,fVar16);
          }
          fVar16 = (params->super_RenderParams).colorScale.m_data[0] * (float)local_b8 +
                   (params->super_RenderParams).colorBias.m_data[0];
          fVar17 = (params->super_RenderParams).colorScale.m_data[1] * (float)uStack_b4 +
                   (params->super_RenderParams).colorBias.m_data[1];
          fVar18 = (params->super_RenderParams).colorScale.m_data[2] * uStack_b4._4_4_ +
                   (params->super_RenderParams).colorBias.m_data[2];
          fVar19 = (params->super_RenderParams).colorScale.m_data[3] * fStack_ac +
                   (params->super_RenderParams).colorBias.m_data[3];
          bVar5 = dst->m_colorMask;
          uVar9 = 0;
          uVar13 = 0;
          if ((bVar5 & 1) != 0) {
            uVar10 = 0x7e - ((int)fVar16 >> 0x17);
            uVar13 = (((uint)fVar16 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar10 & 0x1f)) +
                     0x800000;
            if (8 < uVar10) {
              uVar13 = uVar10;
            }
            uVar13 = uVar13 >> 0x18;
          }
          if ((bVar5 & 2) != 0) {
            uVar10 = 0x7e - ((int)fVar17 >> 0x17);
            uVar9 = (((uint)fVar17 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar10 & 0x1f)) +
                    0x800000;
            if (8 < uVar10) {
              uVar9 = uVar10;
            }
            uVar9 = uVar9 >> 0x10 & 0xff00;
          }
          uVar10 = 0;
          if ((bVar5 & 4) != 0) {
            uVar11 = 0x7e - ((int)fVar18 >> 0x17);
            uVar10 = (((uint)fVar18 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar11 & 0x1f)) +
                     0x800000;
            if (8 < uVar11) {
              uVar10 = uVar11;
            }
            uVar10 = uVar10 >> 8 & 0xff0000;
          }
          uVar11 = 0xff000000;
          if ((bVar5 & 8) != 0) {
            uVar12 = 0x7e - ((int)fVar19 >> 0x17);
            uVar11 = (((uint)fVar19 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar12 & 0x1f)) +
                     0x800000;
            if (8 < uVar12) {
              uVar11 = uVar12;
            }
            uVar11 = uVar11 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)(dst->m_x + iVar15 + (dst->m_y + iVar14) * dst->m_surface->m_width) * 4) =
               uVar9 | uVar13 | uVar10 | uVar11;
          iVar15 = iVar15 + 1;
          iVar8 = dst->m_width;
        } while (iVar15 < iVar8);
        iVar15 = dst->m_height;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < iVar15);
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture1DArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	DE_ASSERT(!(params.flags & ReferenceParams::PROJECTED)); // \todo [2014-06-09 mika] Support projected lookups.
	sampleTextureNonProjected(dst, src, sq, tq, params);
}